

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O0

void borg_flow_reverse(wchar_t depth,_Bool optimize,_Bool avoid,_Bool tunneling,wchar_t stair_idx,
                      _Bool sneak)

{
  _Bool sneak_local;
  wchar_t stair_idx_local;
  _Bool tunneling_local;
  _Bool avoid_local;
  _Bool optimize_local;
  wchar_t depth_local;
  
  borg_flow_clear();
  borg_flow_enqueue_grid(borg.c.y,borg.c.x);
  borg_flow_spread(depth,optimize,avoid,tunneling,stair_idx,sneak);
  return;
}

Assistant:

void borg_flow_reverse(int depth, bool optimize, bool avoid, bool tunneling,
    int stair_idx, bool sneak)
{
    /* Clear the flow codes */
    borg_flow_clear();

    /* Enqueue the player's grid */
    borg_flow_enqueue_grid(borg.c.y, borg.c.x);

    /* Spread, but do NOT optimize */
    borg_flow_spread(depth, optimize, avoid, tunneling, stair_idx, sneak);
}